

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_key2any.c
# Opt level: O0

int ec_pki_priv_to_der(void *veckey,uchar **pder)

{
  uint flags;
  int iVar1;
  uchar **in_RSI;
  EC_KEY *in_RDI;
  int ret;
  uint old_flags;
  EC_KEY *eckey;
  
  flags = EC_KEY_get_enc_flags(in_RDI);
  EC_KEY_set_enc_flags(in_RDI,flags | 1);
  iVar1 = i2d_ECPrivateKey(in_RDI,in_RSI);
  EC_KEY_set_enc_flags(in_RDI,flags);
  return iVar1;
}

Assistant:

static int ec_pki_priv_to_der(const void *veckey, unsigned char **pder)
{
    EC_KEY *eckey = (EC_KEY *)veckey;
    unsigned int old_flags;
    int ret = 0;

    /*
     * For PKCS8 the curve name appears in the PKCS8_PRIV_KEY_INFO object
     * as the pkeyalg->parameter field. (For a named curve this is an OID)
     * The pkey field is an octet string that holds the encoded
     * ECPrivateKey SEQUENCE with the optional parameters field omitted.
     * We omit this by setting the EC_PKEY_NO_PARAMETERS flag.
     */
    old_flags = EC_KEY_get_enc_flags(eckey); /* save old flags */
    EC_KEY_set_enc_flags(eckey, old_flags | EC_PKEY_NO_PARAMETERS);
    ret = i2d_ECPrivateKey(eckey, pder);
    EC_KEY_set_enc_flags(eckey, old_flags); /* restore old flags */
    return ret; /* return the length of the der encoded data */
}